

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O0

int mbedtls_ssl_update_handshake_status(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_handshake_params *pmVar1;
  int iVar2;
  mbedtls_ssl_hs_buffer *local_38;
  mbedtls_ssl_hs_buffer *hs_buf;
  uint offset;
  mbedtls_ssl_handshake_params *hs;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  pmVar1 = ssl->handshake;
  iVar2 = mbedtls_ssl_is_handshake_over(ssl);
  if (((iVar2 == 0) && (pmVar1 != (mbedtls_ssl_handshake_params *)0x0)) &&
     (ssl_local._4_4_ = (*ssl->handshake->update_checksum)(ssl,ssl->in_msg,ssl->in_hslen),
     ssl_local._4_4_ != 0)) {
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0xcfb,"update_checksum",ssl_local._4_4_);
  }
  else {
    if ((ssl->conf->transport == '\x01') && (ssl->handshake != (mbedtls_ssl_handshake_params *)0x0))
    {
      pmVar1->in_msg_seq = pmVar1->in_msg_seq + 1;
      ssl_buffering_free_slot(ssl,'\0');
      local_38 = (pmVar1->buffering).hs;
      for (hs_buf._4_4_ = 0; hs_buf._4_4_ + 1U < 4; hs_buf._4_4_ = hs_buf._4_4_ + 1) {
        *(undefined8 *)local_38 = *(undefined8 *)(local_38 + 1);
        local_38->data = local_38[1].data;
        local_38->data_len = local_38[1].data_len;
        local_38 = local_38 + 1;
      }
      memset(local_38,0,0x18);
    }
    ssl_local._4_4_ = 0;
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_update_handshake_status(mbedtls_ssl_context *ssl)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_ssl_handshake_params * const hs = ssl->handshake;

    if (mbedtls_ssl_is_handshake_over(ssl) == 0 && hs != NULL) {
        ret = ssl->handshake->update_checksum(ssl, ssl->in_msg, ssl->in_hslen);
        if (ret != 0) {
            MBEDTLS_SSL_DEBUG_RET(1, "update_checksum", ret);
            return ret;
        }
    }

    /* Handshake message is complete, increment counter */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake != NULL) {
        unsigned offset;
        mbedtls_ssl_hs_buffer *hs_buf;

        /* Increment handshake sequence number */
        hs->in_msg_seq++;

        /*
         * Clear up handshake buffering and reassembly structure.
         */

        /* Free first entry */
        ssl_buffering_free_slot(ssl, 0);

        /* Shift all other entries */
        for (offset = 0, hs_buf = &hs->buffering.hs[0];
             offset + 1 < MBEDTLS_SSL_MAX_BUFFERED_HS;
             offset++, hs_buf++) {
            *hs_buf = *(hs_buf + 1);
        }

        /* Create a fresh last entry */
        memset(hs_buf, 0, sizeof(mbedtls_ssl_hs_buffer));
    }
#endif
    return 0;
}